

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z2.c
# Opt level: O0

LispPTR N_OP_classoc(LispPTR key,LispPTR list)

{
  uint uVar1;
  LispPTR LVar2;
  LispPTR local_20;
  LispPTR parm;
  LispPTR cdrcell;
  cadr_cell cadr1;
  LispPTR list_local;
  LispPTR key_local;
  
  uVar1 = key & 0xfff0000;
  if ((((uVar1 == 0) || (uVar1 == 0x70000)) || (uVar1 == 0xe0000)) || (uVar1 == 0xf0000)) {
    if (list == 0) {
      list_local = 0;
    }
    else if ((*(ushort *)((ulong)(MDStypetbl + (list >> 9)) ^ 2) & 0x7ff) == 5) {
      if ((*(ushort *)((ulong)(MDStypetbl + (list >> 9)) ^ 2) & 0x7ff) == 5) {
        _parm = cadr(list);
        do {
          local_20 = cdrcell;
          if (((*(ushort *)((ulong)(MDStypetbl + (parm >> 9)) ^ 2) & 0x7ff) == 5) &&
             (LVar2 = car(parm), key == LVar2)) {
            return parm;
          }
          if ((*(ushort *)((ulong)(MDStypetbl + (cdrcell >> 9)) ^ 2) & 0x7ff) == 5) {
            _parm = cadr(cdrcell);
          }
          else {
            local_20 = 0;
          }
          if (MachineState.irqend == 0) {
            MachineState.tosvalue = local_20;
            MachineState.errorexit = 1;
            return 0xfffffffe;
          }
        } while (local_20 != 0);
        list_local = 0;
      }
      else {
        MachineState.errorexit = 1;
        list_local = 0xffffffff;
        MachineState.tosvalue = list;
      }
    }
    else {
      list_local = 0;
    }
  }
  else {
    MachineState.errorexit = 1;
    list_local = 0xffffffff;
    MachineState.tosvalue = list;
  }
  return list_local;
}

Assistant:

LispPTR N_OP_classoc(LispPTR key, LispPTR list) {
  struct cadr_cell cadr1;
  LispPTR cdrcell; /* address of (cdr A-list); Lisp address */

  switch (key & SEGMASK) {
    case S_POSITIVE: break;
    case S_NEGATIVE: break;
    case S_CHARACTER: break;
    case ATOM_OFFSET: break;
    default: ERROR_EXIT(list);
  }
  /* JRB - Don Charnley claims the code below should be identical to the
        code in IL:ASSOC, so I copied my new and exciting version over */

  if (list == NIL_PTR) { return (NIL_PTR); }

  if (GetTypeNumber(list) != TYPE_LISTP) { return (NIL_PTR); }

  S_N_CHECKANDCADR(list, cadr1, list);

  do {
    cdrcell = cadr1.cdr_cell; /* the rest of A-list */
    if (Listp(cadr1.car_cell) && key == car(cadr1.car_cell)) {
      /* cons data found */
      return (cadr1.car_cell);
    }
    /* search the rest of A-list */
    if (Listp(cdrcell))
      cadr1 = cadr(cdrcell);
    else
      cdrcell = NIL;
    /* check for interrupts and punt to handle one safely */
    if (!Irq_Stk_End) {
      TopOfStack = cdrcell; /* for continuation */
      TIMER_EXIT(cdrcell);
    }
  } while (cdrcell != NIL_PTR);

  return (NIL_PTR);
}